

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

float deqp::gles3::Performance::anon_unknown_1::dummyCalculation(float initial,int workSize)

{
  int iVar1;
  undefined4 local_1c;
  undefined4 local_18;
  int ndx;
  int b;
  float a;
  int workSize_local;
  float initial_local;
  
  local_18 = 0x7b;
  ndx = (int)initial;
  for (local_1c = 0; local_1c < workSize; local_1c = local_1c + 1) {
    ndx = (int)deFloatCos((float)ndx + (float)local_18);
    iVar1 = de::abs<int>((int)((float)ndx * 10.0));
    local_18 = (local_18 + 0x3f) % 0x6b + iVar1;
  }
  return (float)ndx + (float)local_18;
}

Assistant:

static float dummyCalculation (float initial, int workSize)
{
	float	a = initial;
	int		b = 123;

	for (int ndx = 0; ndx < workSize; ++ndx)
	{
		a = deFloatCos(a + (float)b);
		b = (b + 63) % 107 + de::abs((int)(a*10.0f));
	}

	return a + (float)b;
}